

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu541.c
# Opt level: O0

void setup_vepu540_force_slice_split(Vepu541H264eRegSet *regs,RK_S32 width)

{
  RK_S32 mb_w;
  RK_S32 width_local;
  Vepu541H264eRegSet *regs_local;
  
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","enter\n","setup_vepu540_force_slice_split");
  }
  regs->reg087 = (anon_struct_4_7_35fe48b9_for_reg087)((uint)regs->reg087 & 0xfffffffe | 1);
  regs->reg087 = (anon_struct_4_7_35fe48b9_for_reg087)((uint)regs->reg087 & 0xfffffffd | 2);
  regs->reg087 = (anon_struct_4_7_35fe48b9_for_reg087)((uint)regs->reg087 & 0xfffffffb);
  regs->reg087 = (anon_struct_4_7_35fe48b9_for_reg087)((uint)regs->reg087 & 0xffffe007 | 4000);
  regs->reg087 = (anon_struct_4_7_35fe48b9_for_reg087)((uint)regs->reg087 & 0xffffdfff | 0x2000);
  regs->reg087 = (anon_struct_4_7_35fe48b9_for_reg087)
                 ((uint)regs->reg087 & 0xffff | ((width + 0xf >> 4) + -1) * 0x10000);
  regs->reg088 = (anon_struct_4_2_c5c57e2e_for_reg088)((uint)regs->reg088 & 0xfffc0000);
  regs->reg013 = (anon_struct_4_17_33ff386d_for_reg013)((uint)regs->reg013 & 0xbfffffff);
  regs->reg023 = (anon_struct_4_2_0aebfcca_for_reg023)((uint)regs->reg023 & 0x7fffffff);
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","leave\n","setup_vepu540_force_slice_split");
  }
  return;
}

Assistant:

static void setup_vepu540_force_slice_split(Vepu541H264eRegSet *regs, RK_S32 width)
{
    RK_S32 mb_w = MPP_ALIGN(width, 16) >> 4;

    hal_h264e_dbg_func("enter\n");

    regs->reg087.sli_splt = 1;
    regs->reg087.sli_splt_mode = 1;
    regs->reg087.sli_splt_cpst = 0;
    regs->reg087.sli_max_num_m1 = 500;
    regs->reg087.sli_flsh = 1;
    regs->reg087.sli_splt_cnum_m1 = mb_w - 1;

    regs->reg088.sli_splt_byte = 0;
    regs->reg013.slen_fifo = 0;
    regs->reg023.sli_crs_en = 0;

    hal_h264e_dbg_func("leave\n");
}